

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_2,_4>,_tcu::Vector<double,_2>,_tcu::Vector<double,_4>_>::call
          (binary<tcu::Matrix<double,_2,_4>,_tcu::Vector<double,_2>,_tcu::Vector<double,_4>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  GLuint GVar4;
  long *plVar5;
  bool bVar6;
  GLdouble *data;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  uint uVar10;
  Matrix<double,_2,_4> result;
  long local_d8 [9];
  undefined8 uStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_60 [8];
  
  lVar8 = 0;
  GVar4 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar2 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  local_d8[6] = 0;
  local_d8[7] = 0;
  local_d8[4] = 0;
  local_d8[5] = 0;
  local_d8[2] = 0;
  local_d8[3] = 0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  plVar5 = local_d8;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    lVar7 = 0;
    do {
      uVar10 = 0x3ff00000;
      if (lVar8 * 0x10 != lVar7) {
        uVar10 = 0;
      }
      *(ulong *)((long)plVar5 + lVar7) = (ulong)uVar10 << 0x20;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar8 = 1;
    plVar5 = local_d8 + 1;
    bVar3 = false;
  } while (bVar6);
  local_d8[8] = *argument_src;
  uStack_90 = *(undefined8 *)((long)argument_src + 8);
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar4);
  local_88 = *puVar1;
  uStack_84 = puVar1[1];
  uStack_80 = puVar1[2];
  uStack_7c = puVar1[3];
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar4 + 0x10);
  local_78 = *puVar1;
  uStack_74 = puVar1[1];
  uStack_70 = puVar1[2];
  uStack_6c = puVar1[3];
  (*pcVar2)(local_60);
  plVar5 = local_d8;
  puVar9 = local_60;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    lVar8 = 0;
    do {
      *(undefined8 *)((long)plVar5 + lVar8) = *(undefined8 *)((long)puVar9 + lVar8);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    plVar5 = local_d8 + 1;
    puVar9 = local_60 + 1;
    bVar3 = false;
  } while (bVar6);
  *(long *)((long)result_dst + 0x10) = local_d8[2];
  *(long *)((long)result_dst + 0x18) = local_d8[3];
  *(long *)result_dst = local_d8[0];
  *(long *)((long)result_dst + 8) = local_d8[1];
  *(long *)((long)result_dst + 0x30) = local_d8[6];
  *(long *)((long)result_dst + 0x38) = local_d8[7];
  *(long *)((long)result_dst + 0x20) = local_d8[4];
  *(long *)((long)result_dst + 0x28) = local_d8[5];
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}